

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O1

void __thiscall
testing::anon_unknown_6::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  int iVar1;
  ostream *this_00;
  int n;
  int n_00;
  int n_01;
  long lVar2;
  char *pcVar3;
  string local_30;
  
  iVar1 = this->max_;
  if (this->min_ != 0) {
    if (this->min_ == iVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"called ",7);
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_30._M_dataplus._M_p,local_30._M_string_length);
    }
    else {
      if (iVar1 != 0x7fffffff) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"called between ",0xf);
        this_00 = (ostream *)std::ostream::operator<<((ostream *)os,this->min_);
        std::__ostream_insert<char,std::char_traits<char>>(this_00," and ",5);
        os = (ostream *)std::ostream::operator<<((ostream *)this_00,this->max_);
        pcVar3 = " times";
        lVar2 = 6;
        goto LAB_0012d0b1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"called at least ",0x10);
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_30._M_dataplus._M_p,local_30._M_string_length);
    }
LAB_0012d0f1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if (iVar1 == 0x7fffffff) {
    pcVar3 = "called any number of times";
    lVar2 = 0x1a;
  }
  else {
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"called at most ",0xf);
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->max_,n_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_30._M_dataplus._M_p,local_30._M_string_length);
      goto LAB_0012d0f1;
    }
    pcVar3 = "never called";
    lVar2 = 0xc;
  }
LAB_0012d0b1:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}